

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GeneratePrivateMembers(Map *this,Printer *p)

{
  char *pcVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  long alStack_258 [4];
  undefined1 auStack_238 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [32];
  string local_1e0;
  string local_1c0;
  Sub local_1a0;
  Sub local_e8;
  
  if (this->lite_ == true) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x3e,"\n          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;\n        ");
    return;
  }
  alStack_258[3] = 0x1aa58a;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"kKeyType","");
  alStack_258[3] = 0x1aa597;
  pcVar1 = DeclaredTypeMethodName((uint)(byte)this->key_[2]);
  alStack_258[3] = 0x1aa5a2;
  sVar2 = strlen(pcVar1);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  alStack_258[3] = 0x1aa5bf;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,pcVar1,pcVar1 + sVar2);
  alStack_258[3] = 0x1aa5c9;
  absl::lts_20240722::AsciiStrToUpper((string *)&local_220);
  alStack_258[3] = 0x1aa5e3;
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_1c0,&local_220);
  alStack_258[3] = 0x1aa60c;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"kValType","");
  alStack_258[3] = 0x1aa619;
  pcVar1 = DeclaredTypeMethodName((uint)(byte)this->val_[2]);
  alStack_258[3] = 0x1aa624;
  sVar2 = strlen(pcVar1);
  alStack_258[3] = 0x1aa641;
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar1,pcVar1 + sVar2);
  alStack_258[3] = 0x1aa64b;
  absl::lts_20240722::AsciiStrToUpper((string *)local_200);
  alStack_258[3] = 0x1aa65d;
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_e8,&local_1e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  alStack_258[3] = 0x1aa67e;
  google::protobuf::io::Printer::Emit
            (p,&local_1a0,2,0xef,
             "\n              $pbi$::$MapField$<$Entry$, $Key$, $Val$,\n                                $pbi$::WireFormatLite::TYPE_$kKeyType$,\n                                $pbi$::WireFormatLite::TYPE_$kValType$>\n                  $name$_;\n            "
            );
  lVar4 = 0x170;
  do {
    if (local_1c0.field_2._M_local_buf[lVar4 + 8] == '\x01') {
      alStack_258[3] = 0x1aa6a8;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_200 + lVar4 + 0x18));
    }
    if ((long *)(local_200 + lVar4) != *(long **)(local_200 + lVar4 + -0x10)) {
      alStack_258[3] = 0x1aa6c4;
      operator_delete(*(long **)(local_200 + lVar4 + -0x10),*(long *)(local_200 + lVar4) + 1);
    }
    alStack_258[3] = 0x1aa6d3;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_200[lVar4 + -0x18]]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_238 + 0x17),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_238 + lVar4));
    plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
    local_200[lVar4 + -0x18] = 0xff;
    if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
      alStack_258[3] = 0x1aa6f3;
      operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    alStack_258[3] = 0x1aa713;
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    alStack_258[3] = 0x1aa72a;
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    alStack_258[3] = 0x1aa746;
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    alStack_258[3] = 0x1aa760;
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Map::GeneratePrivateMembers(io::Printer* p) const {
  if (lite_) {
    p->Emit(
        R"cc(
          $pbi$::MapFieldLite<$Key$, $Val$> $name$_;
        )cc");
  } else {
    p->Emit({{"kKeyType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(key_->type()))},
             {"kValType",
              absl::AsciiStrToUpper(DeclaredTypeMethodName(val_->type()))}},
            R"cc(
              $pbi$::$MapField$<$Entry$, $Key$, $Val$,
                                $pbi$::WireFormatLite::TYPE_$kKeyType$,
                                $pbi$::WireFormatLite::TYPE_$kValType$>
                  $name$_;
            )cc");
  }
}